

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O3

char * __thiscall
flatbuffers::JsonPrinter::GenStruct(JsonPrinter *this,StructDef *struct_def,Table *table,int indent)

{
  ushort uVar1;
  FieldDef *fd;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  IDLOptions *pIVar6;
  byte bVar7;
  int iVar8;
  pointer ppFVar9;
  ulong uVar10;
  Table *prev_val;
  bool bVar11;
  
  std::__cxx11::string::push_back((char)this->text);
  iVar3 = this->opts->indent_step;
  iVar8 = 0;
  iVar5 = 0;
  if (0 < iVar3) {
    iVar5 = iVar3;
  }
  ppFVar9 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar9 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = iVar5 + indent;
    bVar2 = struct_def->fixed;
    prev_val = (Table *)0x0;
    do {
      fd = *ppFVar9;
      bVar11 = true;
      if ((bVar2 & 1) == 0) {
        uVar1 = (fd->value).offset;
        if (uVar1 < *(ushort *)(table + -(long)*(int *)table)) {
          bVar11 = *(short *)(table + ((ulong)uVar1 - (long)*(int *)table)) != 0;
        }
        else {
          bVar11 = false;
        }
      }
      pIVar6 = this->opts;
      if (((pIVar6->output_default_scalars_in_json == false) && (fd->key != true)) ||
         (0xb < (fd->value).type.base_type - BASE_TYPE_UTYPE)) {
        bVar7 = 0;
      }
      else {
        bVar7 = fd->deprecated ^ 1;
      }
      if (bVar11 || (bVar7 & 1) != 0) {
        if ((iVar8 != 0) && (pIVar6->protobuf_ascii_alike == false)) {
          std::__cxx11::string::push_back((char)this->text);
          pIVar6 = this->opts;
        }
        if (-1 < pIVar6->indent_step) {
          std::__cxx11::string::push_back((char)this->text);
        }
        std::__cxx11::string::_M_replace_aux
                  ((ulong)this->text,this->text->_M_string_length,0,(char)iVar5);
        OutputIdentifier(this,(string *)fd);
        if ((this->opts->protobuf_ascii_alike != true) ||
           (((fd->value).type.base_type & ~BASE_TYPE_UTYPE) != BASE_TYPE_VECTOR)) {
          std::__cxx11::string::push_back((char)this->text);
        }
        std::__cxx11::string::push_back((char)this->text);
        switch((fd->value).type.base_type) {
        case BASE_TYPE_NONE:
        case BASE_TYPE_UTYPE:
        case BASE_TYPE_BOOL:
        case BASE_TYPE_UCHAR:
          GenField<unsigned_char>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_CHAR:
          GenField<signed_char>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_SHORT:
          GenField<short>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_USHORT:
          GenField<unsigned_short>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_INT:
          GenField<int>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_UINT:
          GenField<unsigned_int>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_LONG:
          GenField<long>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_ULONG:
          GenField<unsigned_long>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_FLOAT:
          GenField<float>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_DOUBLE:
          GenField<double>(this,fd,table,struct_def->fixed,iVar5);
          break;
        case BASE_TYPE_STRING:
        case BASE_TYPE_VECTOR:
        case BASE_TYPE_STRUCT:
        case BASE_TYPE_UNION:
        case BASE_TYPE_ARRAY:
        case BASE_TYPE_VECTOR64:
          pcVar4 = GenFieldOffset(this,fd,table,struct_def->fixed,iVar5,(uint8_t *)prev_val);
          if (pcVar4 != (char *)0x0) {
            return pcVar4;
          }
        }
        iVar8 = iVar8 + 1;
        bVar2 = struct_def->fixed;
        uVar1 = (fd->value).offset;
        uVar10 = (ulong)uVar1;
        if ((bool)bVar2 != true) {
          if ((*(ushort *)(table + -(long)*(int *)table) <= uVar1) ||
             (*(ushort *)(table + (uVar10 - (long)*(int *)table)) == 0)) {
            prev_val = (Table *)0x0;
            goto LAB_00145357;
          }
          uVar10 = (ulong)*(ushort *)(table + (uVar10 - (long)*(int *)table));
        }
        prev_val = table + uVar10;
      }
LAB_00145357:
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    iVar3 = this->opts->indent_step;
  }
  if (-1 < iVar3) {
    std::__cxx11::string::push_back((char)this->text);
  }
  std::__cxx11::string::_M_replace_aux
            ((ulong)this->text,this->text->_M_string_length,0,(char)indent);
  std::__cxx11::string::push_back((char)this->text);
  return (char *)0x0;
}

Assistant:

const char *GenStruct(const StructDef &struct_def, const Table *table,
                        int indent) {
    text += '{';
    int fieldout = 0;
    const uint8_t *prev_val = nullptr;
    const auto elem_indent = indent + Indent();
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      FieldDef &fd = **it;
      auto is_present = struct_def.fixed || table->CheckField(fd.value.offset);
      auto output_anyway = (opts.output_default_scalars_in_json || fd.key) &&
                           IsScalar(fd.value.type.base_type) && !fd.deprecated;
      if (is_present || output_anyway) {
        if (fieldout++) { AddComma(); }
        AddNewLine();
        AddIndent(elem_indent);
        OutputIdentifier(fd.name);
        if (!opts.protobuf_ascii_alike ||
            (fd.value.type.base_type != BASE_TYPE_STRUCT &&
             fd.value.type.base_type != BASE_TYPE_VECTOR))
          text += ':';
        text += ' ';
        // clang-format off
        switch (fd.value.type.base_type) {
        #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
          case BASE_TYPE_ ## ENUM: { \
            GenField<CTYPE>(fd, table, struct_def.fixed, elem_indent); \
            break; }
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
        // Generate drop-thru case statements for all pointer types:
        #define FLATBUFFERS_TD(ENUM, ...) \
          case BASE_TYPE_ ## ENUM:
              FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
              FLATBUFFERS_GEN_TYPE_ARRAY(FLATBUFFERS_TD)
        #undef FLATBUFFERS_TD
            {
              auto err = GenFieldOffset(fd, table, struct_def.fixed, elem_indent, prev_val);
              if (err) return err;
              break;
            }
        }
        // clang-format on
        // Track prev val for use with union types.
        if (struct_def.fixed) {
          prev_val = reinterpret_cast<const uint8_t *>(table) + fd.value.offset;
        } else {
          prev_val = table->GetAddressOf(fd.value.offset);
        }
      }
    }
    AddNewLine();
    AddIndent(indent);
    text += '}';
    return nullptr;
  }